

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul-lace.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint _n_workers;
  int iVar2;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *ctx_00;
  float *A;
  float *A_00;
  size_t __size;
  double dVar3;
  double dVar4;
  undefined1 local_b0 [24];
  EVP_PKEY_CTX *local_98;
  float *local_90;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  char local_78 [72];
  
  _n_workers = 1;
  iVar2 = 100000;
  while( true ) {
    while( true ) {
      while( true ) {
        iVar1 = getopt(argc,argv,"w:q:h");
        if (iVar1 << 0x18 == -0x1000000) {
          if (_optind != argc) {
            iVar1 = atoi(argv[_optind]);
            __size = (ulong)(uint)(iVar1 * iVar1) << 2;
            ctx = (EVP_PKEY_CTX *)malloc(__size);
            ctx_00 = (EVP_PKEY_CTX *)malloc(__size);
            A = (float *)malloc(__size);
            A_00 = (float *)malloc(__size);
            init(ctx);
            init(ctx_00);
            zero(A,iVar1);
            zero(A_00,iVar1);
            lace_start(_n_workers,(long)iVar2);
            dVar3 = wctime();
            local_b0._0_8_ = rec_matmul_WRAP;
            local_b0._8_8_ = (_Worker *)0x1;
            local_78[0] = '\0';
            local_78[1] = '\0';
            local_78[2] = '\0';
            local_78[3] = '\0';
            local_b0._16_8_ = ctx;
            local_98 = ctx_00;
            local_90 = A_00;
            local_88 = iVar1;
            iStack_84 = iVar1;
            iStack_80 = iVar1;
            iStack_7c = iVar1;
            lace_run_task((Task *)local_b0);
            dVar4 = wctime();
            printf("Time: %f\n",dVar4 - dVar3);
            lace_stop();
            free(A_00);
            free(A);
            free(ctx_00);
            free(ctx);
            return 0;
          }
          usage(*argv);
          exit(1);
        }
        iVar1 = (iVar1 << 0x18) >> 0x18;
        if (iVar1 != 0x68) break;
        usage(*argv);
      }
      if (iVar1 != 0x71) break;
      iVar2 = atoi(_optarg);
    }
    if (iVar1 != 0x77) break;
    _n_workers = atoi(_optarg);
  }
  abort();
}

Assistant:

int main(int argc, char *argv[])
{
    int workers = 1;
    int dqsize = 100000;

    char c;
    while ((c=getopt(argc, argv, "w:q:h")) != -1) {
        switch (c) {
            case 'w':
                workers = atoi(optarg);
                break;
            case 'q':
                dqsize = atoi(optarg);
                break;
            case 'h':
                usage(argv[0]);
                break;
            default:
                abort();
        }
    }

    if (optind == argc) {
        usage(argv[0]);
        exit(1);
    }

    int n = atoi(argv[optind]);

    REAL *A  = malloc(n * n * sizeof(REAL));
    REAL *B  = malloc(n * n * sizeof(REAL));
    REAL *C1 = malloc(n * n * sizeof(REAL));
    REAL *C2 = malloc(n * n * sizeof(REAL));

    init(A, n);
    init(B, n);
    zero(C1, n);
    zero(C2, n);

    lace_start(workers, dqsize);

    double t1 = wctime();
    RUN(rec_matmul, A, B, C2, n, n, n, n, 0); 
    double t2 = wctime();

    printf("Time: %f\n", t2-t1);
/*
    iter_matmul(A, B, C1, n);
    double err = maxerror(C1, C2, n);

    printf("Max error matmul(%d x %d) = %g\n", n, n, err);
*/
    lace_stop();

    free(C2);
    free(C1);
    free(B);
    free(A);
    return 0;
}